

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void * ma_dr_flac__realloc_from_callbacks
                 (void *p,size_t szNew,size_t szOld,ma_allocation_callbacks *pAllocationCallbacks)

{
  undefined8 *in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  void *in_RDI;
  void *p2;
  void *local_8;
  
  if (in_RCX == (undefined8 *)0x0) {
    local_8 = (void *)0x0;
  }
  else if (in_RCX[2] == 0) {
    if ((in_RCX[1] == 0) || (in_RCX[3] == 0)) {
      local_8 = (void *)0x0;
    }
    else {
      local_8 = (void *)(*(code *)in_RCX[1])(in_RSI,*in_RCX);
      if (local_8 == (void *)0x0) {
        local_8 = (void *)0x0;
      }
      else if (in_RDI != (void *)0x0) {
        memcpy(local_8,in_RDI,in_RDX);
        (*(code *)in_RCX[3])(in_RDI,*in_RCX);
      }
    }
  }
  else {
    local_8 = (void *)(*(code *)in_RCX[2])(in_RDI,in_RSI,*in_RCX);
  }
  return local_8;
}

Assistant:

static void* ma_dr_flac__realloc_from_callbacks(void* p, size_t szNew, size_t szOld, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks == NULL) {
        return NULL;
    }
    if (pAllocationCallbacks->onRealloc != NULL) {
        return pAllocationCallbacks->onRealloc(p, szNew, pAllocationCallbacks->pUserData);
    }
    if (pAllocationCallbacks->onMalloc != NULL && pAllocationCallbacks->onFree != NULL) {
        void* p2;
        p2 = pAllocationCallbacks->onMalloc(szNew, pAllocationCallbacks->pUserData);
        if (p2 == NULL) {
            return NULL;
        }
        if (p != NULL) {
            MA_DR_FLAC_COPY_MEMORY(p2, p, szOld);
            pAllocationCallbacks->onFree(p, pAllocationCallbacks->pUserData);
        }
        return p2;
    }
    return NULL;
}